

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

filesystem filesystem_create(char *root,filesystem_flags flags)

{
  trie ptVar1;
  filesystem_flags in_ESI;
  char *in_RDI;
  filesystem fs;
  filesystem local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = (filesystem)0x0;
  }
  else {
    local_8 = (filesystem)malloc(0x18);
    if (local_8 == (filesystem)0x0) {
      log_write_impl_va("metacall",0x28,"filesystem_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/filesystem/source/filesystem.c"
                        ,3,"File system invalid allocation");
      local_8 = (filesystem)0x0;
    }
    else {
      ptVar1 = (trie)trie_create(hash_callback_str,comparable_callback_str);
      local_8->storage = ptVar1;
      if (local_8->storage == (trie)0x0) {
        log_write_impl_va("metacall",0x31,"filesystem_create",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/filesystem/source/filesystem.c"
                          ,3,"File system invalid storage allocation");
        free(local_8);
        local_8 = (filesystem)0x0;
      }
      else {
        local_8->root = in_RDI;
        local_8->flags = in_ESI;
      }
    }
  }
  return local_8;
}

Assistant:

filesystem filesystem_create(const char *root, filesystem_flags flags)
{
	if (root != NULL)
	{
		filesystem fs = malloc(sizeof(struct filesystem_type));

		if (fs == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "File system invalid allocation");

			return NULL;
		}

		fs->storage = trie_create(&hash_callback_str, &comparable_callback_str);

		if (fs->storage == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "File system invalid storage allocation");

			free(fs);

			return NULL;
		}

		fs->root = root;

		fs->flags = flags;

		return fs;
	}

	return NULL;
}